

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::DeleteObsoleteFiles(DBImpl *this)

{
  Env *pEVar1;
  ulong uVar2;
  bool bVar3;
  size_type sVar4;
  reference fname;
  uint64_t uVar5;
  uint64_t uVar6;
  bool local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [32];
  Status local_b8;
  _Self local_b0;
  _Self local_a8;
  _Self local_a0;
  _Self local_98;
  bool local_89;
  ulong uStack_88;
  bool keep;
  size_t i;
  ulong uStack_78;
  FileType type;
  uint64_t number;
  undefined1 local_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  undefined1 local_40 [8];
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> live;
  DBImpl *this_local;
  
  live._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  bVar3 = Status::ok(&this->bg_error_);
  if (bVar3) {
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               local_40,&this->pending_outputs_);
    VersionSet::AddLiveFiles
              (this->versions_,
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               local_40);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_68);
    (*this->env_->_vptr_Env[7])
              (&number,this->env_,&this->dbname_,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_68);
    Status::~Status((Status *)&number);
    for (uStack_88 = 0; uVar2 = uStack_88,
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_68), uVar2 < sVar4; uStack_88 = uStack_88 + 1) {
      fname = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_68,uStack_88);
      bVar3 = ParseFileName(fname,&stack0xffffffffffffff88,(FileType *)((long)&i + 4));
      uVar2 = uStack_78;
      if (bVar3) {
        local_89 = true;
        switch(i._4_4_) {
        case 0:
          uVar5 = VersionSet::LogNumber(this->versions_);
          uVar6 = uStack_78;
          local_139 = true;
          if (uVar2 < uVar5) {
            uVar5 = VersionSet::PrevLogNumber(this->versions_);
            local_139 = uVar6 == uVar5;
          }
          local_89 = local_139;
          break;
        case 1:
        case 4:
        case 6:
          local_89 = true;
          break;
        case 2:
          local_98._M_node =
               (_Base_ptr)
               std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
               find((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                    local_40,&stack0xffffffffffffff88);
          local_a0._M_node =
               (_Base_ptr)
               std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
               end((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   local_40);
          local_89 = std::operator!=(&local_98,&local_a0);
          break;
        case 3:
          uVar6 = VersionSet::ManifestFileNumber(this->versions_);
          local_89 = uVar6 <= uVar2;
          break;
        case 5:
          local_a8._M_node =
               (_Base_ptr)
               std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
               find((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                    local_40,&stack0xffffffffffffff88);
          local_b0._M_node =
               (_Base_ptr)
               std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
               end((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   local_40);
          local_89 = std::operator!=(&local_a8,&local_b0);
        }
        if (local_89 == false) {
          if (i._4_4_ == 2) {
            TableCache::Evict(this->table_cache_,uStack_78);
          }
          Log((this->options_).info_log,"Delete type=%d #%lld\n",(ulong)i._4_4_,uStack_78);
          pEVar1 = this->env_;
          std::operator+(local_f8,(char *)&this->dbname_);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_68,uStack_88);
          std::operator+(local_d8,local_f8);
          (*pEVar1->_vptr_Env[8])(&local_b8,pEVar1,local_d8);
          Status::~Status(&local_b8);
          std::__cxx11::string::~string((string *)local_d8);
          std::__cxx11::string::~string((string *)local_f8);
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_68);
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               local_40);
  }
  return;
}

Assistant:

void DBImpl::DeleteObsoleteFiles() {
  if (!bg_error_.ok()) {
    // After a background error, we don't know whether a new version may
    // or may not have been committed, so we cannot safely garbage collect.
    return;
  }

  // Make a set of all of the live files
  std::set<uint64_t> live = pending_outputs_;
  versions_->AddLiveFiles(&live);

  std::vector<std::string> filenames;
  env_->GetChildren(dbname_, &filenames); // Ignoring errors on purpose
  uint64_t number;
  FileType type;
  for (size_t i = 0; i < filenames.size(); i++) {
    if (ParseFileName(filenames[i], &number, &type)) {
      bool keep = true;
      switch (type) {
        case kLogFile:
          keep = ((number >= versions_->LogNumber()) ||
              (number==versions_->PrevLogNumber()));
          break;
        case kDescriptorFile:
          // Keep my manifest file, and any newer incarnations'
          // (in case there is a race that allows other incarnations)
          keep = (number >= versions_->ManifestFileNumber());
          break;
        case kTableFile:keep = (live.find(number)!=live.end());
          break;
        case kTempFile:
          // Any temp files that are currently being written to must
          // be recorded in pending_outputs_, which is inserted into "live"
          keep = (live.find(number)!=live.end());
          break;
        case kCurrentFile:
        case kDBLockFile:
        case kInfoLogFile:keep = true;
          break;
      }

      if (!keep) {
        if (type==kTableFile) {
          table_cache_->Evict(number);
        }
        Log(options_.info_log, "Delete type=%d #%lld\n",
            int(type),
            static_cast<unsigned long long>(number));
        env_->DeleteFile(dbname_ + "/" + filenames[i]);
      }
    }
  }
}